

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall
fmt::internal::ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> *this,Arg *arg)

{
  FormatError *this_00;
  ulong uVar1;
  
  switch(*(undefined4 *)(this + 0x10)) {
  case 2:
  case 7:
    uVar1 = (ulong)*(uint *)this;
    break;
  case 3:
    uVar1 = (ulong)*(uint *)this;
    if ((int)*(uint *)this < 0) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x20b1a5);
LAB_001db92a:
      __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
    }
    break;
  case 4:
    uVar1 = *(ulong *)this;
    if ((long)(int)uVar1 != uVar1) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x20b1a5);
      goto LAB_001db92a;
    }
    break;
  case 5:
    uVar1 = *(ulong *)this;
    if ((uVar1 & 0xffffffff80000000) != 0) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x20b1a5);
      goto LAB_001db92a;
    }
    break;
  case 6:
    uVar1 = (ulong)(*(int *)this != 0);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    visit_unhandled_arg(this);
  default:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/cppformat/cppformat/format.h"
                  ,0x4f9,
                  "Result fmt::internal::ArgVisitor<fmt::(anonymous namespace)::PrecisionHandler, int>::visit(const Arg &) [Impl = fmt::(anonymous namespace)::PrecisionHandler, Result = int]"
                 );
  }
  return (int)uVar1;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    default:
      FMT_ASSERT(false, "invalid argument type");
      return Result();
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
  }